

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int arg_file_scanfn(arg_file *parent,char *argval)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  byte *pbVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  
  iVar1 = parent->count;
  if (iVar1 == (parent->hdr).maxcount) {
    return 2;
  }
  if (argval == (char *)0x0) goto LAB_00105945;
  parent->filename[iVar1] = argval;
  pcVar2 = strrchr(argval,0x2f);
  pbVar4 = (byte *)(pcVar2 + 1);
  if (pcVar2 == (char *)0x0) {
    pbVar4 = (byte *)argval;
  }
  if (*pbVar4 == 0x2e) {
    if (pbVar4[1] != 0) {
      uVar6 = pbVar4[1] - 0x2e;
      if (uVar6 == 0) {
        uVar6 = (uint)pbVar4[2];
      }
      iVar7 = -uVar6;
      goto LAB_001058d2;
    }
LAB_001058d6:
    sVar3 = strlen(argval);
    pbVar4 = (byte *)(argval + sVar3);
  }
  else {
    iVar7 = 0x2e - (uint)*pbVar4;
LAB_001058d2:
    if (iVar7 == 0) goto LAB_001058d6;
  }
  parent->basename[iVar1] = (char *)pbVar4;
  pcVar2 = parent->basename[iVar1];
  if (pcVar2 == (char *)0x0) {
LAB_0010593b:
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = strrchr(pcVar2,0x2e);
    if (pcVar5 == (char *)0x0) {
      sVar3 = strlen(pcVar2);
      pcVar5 = pcVar2 + sVar3;
    }
    if (pcVar5 == pcVar2) {
      sVar3 = strlen(pcVar2);
      pcVar5 = pcVar2 + sVar3;
    }
    if (pcVar5 == (char *)0x0) goto LAB_0010593b;
    if (pcVar5[1] == '\0') {
      sVar3 = strlen(pcVar2);
      pcVar5 = pcVar2 + sVar3;
    }
  }
  parent->extension[iVar1] = pcVar5;
LAB_00105945:
  parent->count = iVar1 + 1;
  return 0;
}

Assistant:

static int arg_file_scanfn(struct arg_file * parent, const char * argval) {
	int errorcode = 0;

	if (parent->count == parent->hdr.maxcount) {
		/* maximum number of arguments exceeded */
		errorcode = EMAXCOUNT;
	} else if (!argval) {
		/* a valid argument with no argument value was given. */
		/* This happens when an optional argument value was invoked. */
		/* leave parent arguiment value unaltered but still count the argument. */
		parent->count++;
	} else {
		parent->filename[parent->count]  = argval;
		parent->basename[parent->count]  = arg_basename(argval);
		parent->extension[parent->count] =
			arg_extension(parent->basename[parent->count]);                                /* only seek extensions within the basename (not the file path)*/
		parent->count++;
	}

	ARG_TRACE(("%s4:scanfn(%p) returns %d\n", __FILE__, parent, errorcode));
	return errorcode;
}